

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_source.c
# Opt level: O0

RK_S32 camera_source_ioctl(RK_S32 fd,RK_S32 req,void *arg)

{
  int iVar1;
  int *piVar2;
  undefined1 auStack_28 [4];
  RK_S32 ret;
  timespec poll_time;
  void *arg_local;
  RK_S32 req_local;
  RK_S32 fd_local;
  
  poll_time.tv_nsec = (__syscall_slong_t)arg;
  while ((iVar1 = ioctl(fd,(long)req,poll_time.tv_nsec), iVar1 != 0 &&
         (((iVar1 != -1 || (piVar2 = __errno_location(), *piVar2 == 4)) ||
          (piVar2 = __errno_location(), *piVar2 == 0xb))))) {
    _auStack_28 = 0;
    poll_time.tv_sec = 10000000;
    nanosleep((timespec *)auStack_28,(timespec *)0x0);
  }
  return iVar1;
}

Assistant:

static RK_S32 camera_source_ioctl(RK_S32 fd, RK_S32 req, void* arg)
{
    struct timespec poll_time;
    RK_S32 ret;

    while ((ret = ioctl(fd, req, arg))) {
        if (ret == -1 && (EINTR != errno && EAGAIN != errno)) {
            // mpp_err("ret = %d, errno %d", ret, errno);
            break;
        }
        // 10 milliseconds
        poll_time.tv_sec = 0;
        poll_time.tv_nsec = 10000000;
        nanosleep(&poll_time, NULL);
    }

    return ret;
}